

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O0

float If_CutEdgeDerefed(If_Man_t *p,If_Cut_t *pCut)

{
  float fVar1;
  float aResult2;
  float aResult;
  If_Cut_t *pCut_local;
  If_Man_t *p_local;
  
  if (*(uint *)&pCut->field_0x1c >> 0x18 < 2) {
    p_local._4_4_ = (float)(byte)pCut->field_0x1f;
  }
  else {
    fVar1 = If_CutEdgeRef(p,pCut);
    p_local._4_4_ = If_CutEdgeDeref(p,pCut);
    if (p_local._4_4_ <= p->fEpsilon * -3.0 + fVar1) {
      __assert_fail("aResult > aResult2 - 3*p->fEpsilon",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifCut.c"
                    ,0x4ba,"float If_CutEdgeDerefed(If_Man_t *, If_Cut_t *)");
    }
    if (p->fEpsilon * 3.0 + fVar1 <= p_local._4_4_) {
      __assert_fail("aResult < aResult2 + 3*p->fEpsilon",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifCut.c"
                    ,0x4bb,"float If_CutEdgeDerefed(If_Man_t *, If_Cut_t *)");
    }
  }
  return p_local._4_4_;
}

Assistant:

float If_CutEdgeDerefed( If_Man_t * p, If_Cut_t * pCut )
{
    float aResult, aResult2;
    if ( pCut->nLeaves < 2 )
        return pCut->nLeaves;
    aResult2 = If_CutEdgeRef( p, pCut );
    aResult  = If_CutEdgeDeref( p, pCut );
    assert( aResult > aResult2 - 3*p->fEpsilon );
    assert( aResult < aResult2 + 3*p->fEpsilon );
    return aResult;
}